

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

ON_Curve * __thiscall ON_RevSurface::IsoCurve(ON_RevSurface *this,int dir,double c)

{
  ON_Curve *this_00;
  double dVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  ON_ArcCurve *this_01;
  undefined4 extraout_var;
  ON_3dVector local_270;
  double local_258;
  double t;
  double a;
  double dStack_240;
  undefined1 local_238 [8];
  ON_Arc arc;
  ON_3dVector local_188;
  undefined1 local_170 [8];
  ON_3dPoint Q;
  ON_3dPoint local_148;
  ON_3dVector local_130;
  ON_3dVector local_118;
  ON_3dPoint local_100;
  undefined1 auStack_d8 [8];
  ON_3dPoint P;
  undefined1 auStack_b8 [8];
  ON_Circle circle;
  ON_Curve *crv;
  double c_local;
  int dir_local;
  ON_RevSurface *this_local;
  
  if (((dir < 0) || (1 < dir)) || (this->m_curve == (ON_Curve *)0x0)) {
    this_local = (ON_RevSurface *)0x0;
  }
  else {
    circle.radius = 0.0;
    c_local._4_4_ = dir;
    if ((this->m_bTransposed & 1U) != 0) {
      c_local._4_4_ = 1 - dir;
    }
    if (c_local._4_4_ == 0) {
      ON_Circle::ON_Circle((ON_Circle *)auStack_b8);
      ON_Curve::PointAt((ON_3dPoint *)auStack_d8,this->m_curve,c);
      ON_Line::ClosestPointTo(&local_100,&this->m_axis,(ON_3dPoint *)auStack_d8);
      circle.plane.origin.y = local_100.z;
      auStack_b8 = (undefined1  [8])local_100.x;
      circle.plane.origin.x = local_100.y;
      ON_Line::Tangent(&local_118,&this->m_axis);
      circle.plane.zaxis.y = local_118.z;
      circle.plane.yaxis.z = local_118.x;
      circle.plane.zaxis.x = local_118.y;
      ON_3dPoint::operator-(&local_130,(ON_3dPoint *)auStack_d8,(ON_3dPoint *)auStack_b8);
      circle.plane.xaxis.y = local_130.z;
      circle.plane.origin.z = local_130.x;
      circle.plane.xaxis.x = local_130.y;
      circle.plane.plane_equation.d = ON_3dVector::Length((ON_3dVector *)&circle.plane.origin.z);
      bVar3 = ON_3dVector::Unitize((ON_3dVector *)&circle.plane.origin.z);
      if (!bVar3) {
        this_00 = this->m_curve;
        (*(this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
        dVar1 = ON_Interval::ParameterAt((ON_Interval *)&Q.z,0.5);
        ON_Curve::PointAt(&local_148,this_00,dVar1);
        P.y = local_148.z;
        auStack_d8 = (undefined1  [8])local_148.x;
        P.x = local_148.y;
        ON_Line::ClosestPointTo((ON_3dPoint *)local_170,&this->m_axis,(ON_3dPoint *)auStack_d8);
        ON_3dPoint::operator-(&local_188,(ON_3dPoint *)auStack_d8,(ON_3dPoint *)local_170);
        circle.plane.xaxis.y = local_188.z;
        circle.plane.origin.z = local_188.x;
        circle.plane.xaxis.x = local_188.y;
        bVar3 = ON_3dVector::Unitize((ON_3dVector *)&circle.plane.origin.z);
        if (!bVar3) {
          ON_3dVector::PerpendicularTo
                    ((ON_3dVector *)&circle.plane.origin.z,(ON_3dVector *)&circle.plane.yaxis.z);
        }
      }
      ON_CrossProduct((ON_3dVector *)(arc.m_angle.m_t + 1),(ON_3dVector *)&circle.plane.yaxis.z,
                      (ON_3dVector *)&circle.plane.origin.z);
      circle.plane.xaxis.z = arc.m_angle.m_t[1];
      ON_3dVector::Unitize((ON_3dVector *)&circle.plane.xaxis.z);
      ON_Plane::UpdateEquation((ON_Plane *)auStack_b8);
      a = (this->m_angle).m_t[0];
      dStack_240 = (this->m_angle).m_t[1];
      ON_Arc::ON_Arc((ON_Arc *)local_238,(ON_Circle *)auStack_b8,(ON_Interval)*&(this->m_angle).m_t)
      ;
      this_01 = (ON_ArcCurve *)operator_new(0xc0);
      dVar1 = ON_Interval::operator[](&this->m_t,0);
      dVar2 = ON_Interval::operator[](&this->m_t,1);
      ON_ArcCurve::ON_ArcCurve(this_01,(ON_Arc *)local_238,dVar1,dVar2);
      circle.radius = (double)this_01;
      ON_Arc::~ON_Arc((ON_Arc *)local_238);
      ON_Circle::~ON_Circle((ON_Circle *)auStack_b8);
    }
    else if ((c_local._4_4_ == 1) && (this->m_curve != (ON_Curve *)0x0)) {
      iVar4 = (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])();
      circle.radius = (double)CONCAT44(extraout_var,iVar4);
      if (circle.radius != 0.0) {
        t = c;
        bVar3 = ON_Interval::operator!=(&this->m_t,&this->m_angle);
        if (bVar3) {
          local_258 = ON_Interval::NormalizedParameterAt(&this->m_t,c);
          t = ON_Interval::ParameterAt(&this->m_angle,local_258);
        }
        dVar2 = circle.radius;
        dVar1 = t;
        if ((t != 0.0) || (NAN(t))) {
          ON_Line::Direction(&local_270,&this->m_axis);
          ON_Geometry::Rotate((ON_Geometry *)dVar2,dVar1,&local_270,&(this->m_axis).from);
        }
      }
    }
    this_local = (ON_RevSurface *)circle.radius;
  }
  return (ON_Curve *)this_local;
}

Assistant:

ON_Curve* ON_RevSurface::IsoCurve( int dir, double c ) const
{
  if ( dir < 0 || dir > 1 || !m_curve )
    return nullptr;

  ON_Curve* crv = 0;
  
  if ( m_bTransposed )
    dir = 1-dir;

  if ( dir == 0 )
  {
    // 8 December 2003 Chuck - fix iso extraction bug
    //   when m_angle[0] != 0.
    ON_Circle circle;
    ON_3dPoint P = m_curve->PointAt(c);
    circle.plane.origin = m_axis.ClosestPointTo(P);
    circle.plane.zaxis = m_axis.Tangent();
    circle.plane.xaxis = P - circle.plane.origin;
    circle.radius = circle.plane.xaxis.Length();
    if ( !circle.plane.xaxis.Unitize() )
    {
      // 8 December 2003 Dale Lear - get valid zero radius
      //   arc/circle when revolute hits the axis.
      // First: try middle of revolute for x-axis
      P = m_curve->PointAt(m_curve->Domain().ParameterAt(0.5));
      ON_3dPoint Q = m_axis.ClosestPointTo(P);
      circle.plane.xaxis = P-Q;
      if ( !circle.plane.xaxis.Unitize() )
      {
        // Then: just use a vector perp to zaxis
        circle.plane.xaxis.PerpendicularTo(circle.plane.zaxis);
      }
    }
    circle.plane.yaxis = ON_CrossProduct( circle.plane.zaxis, circle.plane.xaxis );
    circle.plane.yaxis.Unitize();
    circle.plane.UpdateEquation();
    ON_Arc arc( circle, m_angle );
    crv = new ON_ArcCurve(arc, m_t[0], m_t[1]);
  }
  else if ( dir == 1 && m_curve )
  {
    crv = m_curve->DuplicateCurve();
    if ( crv )
    {
      double a = c;
      if ( m_t != m_angle )
      {
        double t = m_t.NormalizedParameterAt(c);
        a = m_angle.ParameterAt(t);
      }
      if ( a != 0.0 )
      {
        crv->Rotate( a, m_axis.Direction(), m_axis.from );
      }
    }
  }
  return crv;
}